

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> * __thiscall
kratos::PackedStructGraph::get_structs
          (vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
           *__return_storage_ptr__,PackedStructGraph *this)

{
  iterator iVar1;
  size_type __n;
  __node_base *p_Var2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
  *__range1;
  undefined1 local_c0 [8];
  unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  visited;
  queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
  queue;
  PackedStructNode *node;
  
  local_c0 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  queue<kratos::PackedStructNode*,std::deque<kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>>>
  ::queue<std::deque<kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>>,void>
            ((queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
              *)&visited._M_h._M_single_bucket);
  p_Var2 = &(this->nodes_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    queue.c.
    super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)(p_Var2 + 5);
    iVar1 = std::
            _Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find((_Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_c0,
                   (key_type *)
                   &queue.c.
                    super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (iVar1.super__Node_iterator_base<kratos::PackedStructNode_*,_false>._M_cur ==
        (__node_type *)0x0) {
      topological_sort_helper
                (this,(PackedStructNode *)
                      queue.c.
                      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node,
                 (unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                  *)local_c0,
                 (queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                  *)&visited._M_h._M_single_bucket);
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>::size
                  ((deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_> *
                   )&visited._M_h._M_single_bucket);
  std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>::reserve
            (__return_storage_ptr__,__n);
  while (queue.c.
         super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         queue.c.
         super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>.
         _M_impl.super__Deque_impl_data._M_map_size) {
    std::vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>>::
    emplace_back<kratos::PackedStruct_const*&>
              ((vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>> *)
               __return_storage_ptr__,
               (PackedStruct **)
               (*(long *)queue.c.
                         super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                         ._M_impl.super__Deque_impl_data._M_map_size + 8));
    std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>::pop_front
              ((deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_> *)
               &visited._M_h._M_single_bucket);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<kratos::PackedStruct_const**,std::vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>>>>
            ((__return_storage_ptr__->
             super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  std::_Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>::
  ~_Deque_base((_Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                *)&visited._M_h._M_single_bucket);
  std::
  _Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::PackedStructNode_*>,_std::hash<kratos::PackedStructNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const PackedStruct *> PackedStructGraph::get_structs() {
    // leaf nodes need to be returned first
    std::unordered_set<PackedStructNode *> visited;
    std::queue<PackedStructNode *> queue;
    for (auto &iter : nodes_) {
        auto *node = &iter.second;
        if (visited.find(node) == visited.end()) {
            // visit it
            topological_sort_helper(this, node, visited, queue);
        }
    }
    std::vector<const PackedStruct *> result;
    result.reserve(queue.size());
    while (!queue.empty()) {
        result.emplace_back(queue.front()->struct_);
        queue.pop();
    }
    std::reverse(result.begin(), result.end());
    return result;
}